

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::JsonCodec::encode(JsonCodec *this,Reader *input,Type type,Builder output)

{
  HandlerBase *pHVar1;
  Builder output_00;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  Field field_07;
  Builder output_01;
  Builder output_02;
  Builder BVar2;
  ReaderFor<bool> value_00;
  bool bVar3;
  Which WVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  Impl *pIVar8;
  size_t sVar9;
  byte *pbVar10;
  NullableValue<capnp::EnumSchema::Enumerant> *other;
  Enumerant *pEVar11;
  ulong size;
  unsigned_long *puVar12;
  Field *this_00;
  bool *pbVar13;
  Field **ppFVar14;
  float fVar15;
  ReaderFor<double> value_01;
  Type type_00;
  ReaderFor<capnp::DynamicEnum> RVar16;
  Reader value_02;
  ArrayPtr<bool> AVar17;
  Range<unsigned_long> RVar18;
  ArrayPtr<const_char> AVar19;
  byte local_d6d;
  Fault local_c78;
  Fault f_2;
  Fault f_1;
  Fault f;
  undefined1 local_c58 [8];
  DebugComparison<unsigned_long_&,_unsigned_int_&> _kjCondition;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  Reader local_bc0;
  Field *local_b78;
  Schema SStack_b70;
  uint local_b68;
  undefined4 uStack_b64;
  SegmentReader *pSStack_b60;
  CapTableReader *local_b58;
  void *pvStack_b50;
  WirePointer *local_b48;
  StructDataBitCount SStack_b40;
  StructPointerCount SStack_b3c;
  undefined2 uStack_b3a;
  Builder local_b30;
  Reader local_b08;
  ArrayPtr<const_char> local_ad8;
  undefined1 local_ac8 [8];
  Builder outField_2;
  Fault local_a98;
  Field *local_a90;
  Field *_kj_result;
  Field unionField_1;
  Builder local_a40;
  Field *local_a18;
  Schema SStack_a10;
  uint local_a08;
  undefined4 uStack_a04;
  SegmentReader *pSStack_a00;
  CapTableReader *local_9f8;
  void *pvStack_9f0;
  WirePointer *local_9e8;
  StructDataBitCount SStack_9e0;
  StructPointerCount SStack_9dc;
  undefined2 uStack_9da;
  Reader local_9d0;
  Field *local_988;
  Schema SStack_980;
  uint local_978;
  undefined4 uStack_974;
  SegmentReader *pSStack_970;
  CapTableReader *local_968;
  void *pvStack_960;
  WirePointer *local_958;
  StructDataBitCount SStack_950;
  StructPointerCount SStack_94c;
  undefined2 uStack_94a;
  Reader local_940;
  ArrayPtr<const_char> local_910;
  undefined1 local_900 [8];
  Builder outField_1;
  Builder local_8d0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  Reader local_860;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  Builder local_7d0;
  Reader local_7a8;
  ArrayPtr<const_char> local_778;
  undefined1 local_768 [8];
  Builder outField;
  Field *unionField;
  Field *_unionField333;
  Field field_1;
  unsigned_long i_3;
  Iterator __end3_3;
  Iterator __begin3_3;
  Range<unsigned_long> *__range3_3;
  size_t pos;
  Builder object;
  Reader local_688;
  RawBrandedSchema *local_658;
  undefined8 uStack_650;
  SegmentReader *local_648;
  CapTableReader *pCStack_640;
  void *local_638;
  WirePointer *pWStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  Field *local_618;
  Field *field;
  Field *_field317;
  undefined1 local_600 [7];
  bool unionFieldIsNull;
  Maybe<capnp::StructSchema::Field> which;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  uint local_578;
  unsigned_long i_2;
  Iterator __end3_2;
  Iterator __begin3_2;
  Range<unsigned_long> *__range3_2;
  undefined1 auStack_540 [4];
  uint fieldCount;
  ArrayPtr<bool> hasField;
  Array<bool> hasField_heap;
  bool hasField_stack [32];
  bool hasField_isOnStack;
  size_t hasField_size;
  undefined1 local_4d8 [8];
  FieldSubset nonUnionFields;
  ReaderFor<capnp::DynamicStruct> structValue;
  Enumerant *symbol;
  undefined1 local_3c8 [8];
  NullableValue<capnp::EnumSchema::Enumerant> _symbol295;
  undefined1 local_370 [8];
  ReaderFor<capnp::DynamicEnum> e;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  Reader local_328;
  unsigned_long local_2e0;
  unsigned_long i_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  Range<unsigned_long> *__range3_1;
  Builder array_1;
  Type elementType;
  ReaderFor<capnp::DynamicList> list;
  uint local_200;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Builder array;
  ReaderFor<capnp::Data> bytes;
  String local_188;
  ArrayPtr<const_char> local_170;
  ReaderFor<unsigned_long> local_160;
  String local_158;
  ArrayPtr<const_char> local_140;
  ReaderFor<long> local_130;
  String local_128;
  ArrayPtr<const_char> local_110;
  ArrayPtr<const_char> local_100;
  ArrayPtr<const_char> local_f0;
  ArrayPtr<const_char> local_e0;
  double local_d0;
  double value;
  SegmentBuilder *local_b8;
  CapTableBuilder *pCStack_b0;
  void *local_a8;
  WirePointer *pWStack_a0;
  undefined8 local_98;
  Reader local_88;
  HandlerBase **local_40;
  HandlerBase **handler;
  HandlerBase **local_30;
  HandlerBase **_handler229;
  Reader *input_local;
  JsonCodec *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  _handler229 = (HandlerBase **)input;
  input_local = (Reader *)this;
  pIVar8 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
  kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::Type&>
            ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)&handler,
             (Type *)&pIVar8->typeHandlers);
  local_40 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>
                       ((Maybe<capnp::JsonCodec::HandlerBase_*const_&> *)&handler);
  local_30 = local_40;
  if (local_40 == (HandlerBase **)0x0) {
    WVar4 = capnp::Type::which((Type *)&this_local);
    switch(WVar4) {
    case VOID:
      json::Value::Builder::setNull(&output);
      break;
    case BOOL:
      value_00 = DynamicValue::Reader::as<bool>(input);
      json::Value::Builder::setBoolean(&output,value_00);
      break;
    case INT8:
    case INT16:
    case INT32:
    case UINT8:
    case UINT16:
    case UINT32:
      value_01 = DynamicValue::Reader::as<double>(input);
      json::Value::Builder::setNumber(&output,value_01);
      break;
    case INT64:
      local_130 = DynamicValue::Reader::as<long>(input);
      kj::str<long>(&local_128,&local_130);
      Text::Reader::Reader((Reader *)&local_110,&local_128);
      json::Value::Builder::setString(&output,(Reader)local_110);
      kj::String::~String(&local_128);
      break;
    case UINT64:
      local_160 = DynamicValue::Reader::as<unsigned_long>(input);
      kj::str<unsigned_long>(&local_158,&local_160);
      Text::Reader::Reader((Reader *)&local_140,&local_158);
      json::Value::Builder::setString(&output,(Reader)local_140);
      kj::String::~String(&local_158);
      break;
    case FLOAT32:
    case FLOAT64:
      local_d0 = DynamicValue::Reader::as<double>(input);
      fVar15 = kj::inf();
      if (((double)fVar15 != local_d0) || (NAN((double)fVar15) || NAN(local_d0))) {
        fVar15 = kj::inf();
        if (((double)-fVar15 != local_d0) || (NAN((double)-fVar15) || NAN(local_d0))) {
          bVar3 = kj::isNaN(local_d0);
          if (bVar3) {
            Text::Reader::Reader((Reader *)&local_100,"NaN");
            json::Value::Builder::setString(&output,(Reader)local_100);
          }
          else {
            json::Value::Builder::setNumber(&output,local_d0);
          }
        }
        else {
          Text::Reader::Reader((Reader *)&local_f0,"-Infinity");
          json::Value::Builder::setString(&output,(Reader)local_f0);
        }
      }
      else {
        Text::Reader::Reader((Reader *)&local_e0,"Infinity");
        json::Value::Builder::setString(&output,(Reader)local_e0);
      }
      break;
    case TEXT:
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(input);
      kj::str<capnp::Text::Reader>
                (&local_188,(Reader *)&bytes.super_ArrayPtr<const_unsigned_char>.size_);
      Text::Reader::Reader((Reader *)&local_170,&local_188);
      json::Value::Builder::setString(&output,(Reader)local_170);
      kj::String::~String(&local_188);
      break;
    case DATA:
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(input);
      sVar9 = kj::ArrayPtr<const_unsigned_char>::size
                        ((ArrayPtr<const_unsigned_char> *)&array.builder.structDataSize);
      json::Value::Builder::initArray((Builder *)&__range3,&output,(uint)sVar9);
      ___begin3 = kj::indices<capnp::Data::Reader&>((Reader *)&array.builder.structDataSize);
      __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
      while (bVar3 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        puVar12 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
        sVar9 = *puVar12;
        local_200 = (uint)sVar9;
        List<capnp::json::Value,_(capnp::Kind)3>::Builder::operator[]
                  ((Builder *)&list.reader.nestingLimit,(Builder *)&__range3,local_200);
        pbVar10 = kj::ArrayPtr<const_unsigned_char>::operator[]
                            ((ArrayPtr<const_unsigned_char> *)&array.builder.structDataSize,sVar9);
        json::Value::Builder::setNumber((Builder *)&list.reader.nestingLimit,(double)*pbVar10);
        kj::Range<unsigned_long>::Iterator::operator++(&__end3);
      }
      break;
    case LIST:
      DynamicValue::Reader::as<capnp::DynamicList>
                ((ReaderFor<capnp::DynamicList> *)&elementType.field_4,input);
      join_0x00000010_0x00000000_ = (Type)capnp::Type::asList((Type *)&this_local);
      type_00 = ListSchema::getElementType((ListSchema *)&array_1.builder.structDataSize);
      uVar6 = DynamicList::Reader::size((Reader *)&elementType.field_4);
      json::Value::Builder::initArray((Builder *)&__range3_1,&output,uVar6);
      ___begin3_1 = kj::indices<capnp::DynamicList::Reader&>((Reader *)&elementType.field_4);
      __end3_1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3_1);
      i_1 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3_1);
      while (bVar3 = kj::Range<unsigned_long>::Iterator::operator==(&__end3_1,(Iterator *)&i_1),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        puVar12 = kj::Range<unsigned_long>::Iterator::operator*(&__end3_1);
        local_2e0 = *puVar12;
        DynamicList::Reader::operator[](&local_328,(Reader *)&elementType.field_4,(uint)local_2e0);
        List<capnp::json::Value,_(capnp::Kind)3>::Builder::operator[]
                  ((Builder *)&e.value,(Builder *)&__range3_1,(uint)local_2e0);
        output_00._builder.capTable = (CapTableBuilder *)uStack_358;
        output_00._builder.segment = (SegmentBuilder *)e._8_8_;
        output_00._builder.data._0_4_ = (int)local_350;
        output_00._builder.data._4_4_ = (int)((ulong)local_350 >> 0x20);
        output_00._builder.pointers._0_4_ = (int)uStack_348;
        output_00._builder.pointers._4_4_ = (int)((ulong)uStack_348 >> 0x20);
        output_00._builder._32_8_ = local_340;
        encode(this,&local_328,type_00,output_00);
        DynamicValue::Reader::~Reader(&local_328);
        kj::Range<unsigned_long>::Iterator::operator++(&__end3_1);
      }
      break;
    case ENUM:
      RVar16 = DynamicValue::Reader::as<capnp::DynamicEnum>(input);
      _symbol295.field_1._56_8_ = RVar16.schema.super_Schema.raw;
      e.schema.super_Schema.raw._0_2_ = RVar16.value;
      local_370 = (undefined1  [8])_symbol295.field_1._56_8_;
      DynamicEnum::getEnumerant
                ((Maybe<capnp::EnumSchema::Enumerant> *)&symbol,(DynamicEnum *)local_370);
      other = kj::_::readMaybe<capnp::EnumSchema::Enumerant>
                        ((Maybe<capnp::EnumSchema::Enumerant> *)&symbol);
      kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
                ((NullableValue<capnp::EnumSchema::Enumerant> *)local_3c8,other);
      kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe
                ((Maybe<capnp::EnumSchema::Enumerant> *)&symbol);
      pEVar11 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_3c8);
      if (pEVar11 == (Enumerant *)0x0) {
        uVar5 = DynamicEnum::getRaw((DynamicEnum *)local_370);
        json::Value::Builder::setNumber(&output,(double)uVar5);
      }
      else {
        pEVar11 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator*
                            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_3c8);
        EnumSchema::Enumerant::getProto((Reader *)&structValue.reader.nestingLimit,pEVar11);
        value_02 = capnp::schema::Enumerant::Reader::getName
                             ((Reader *)&structValue.reader.nestingLimit);
        json::Value::Builder::setString(&output,value_02);
      }
      kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
                ((NullableValue<capnp::EnumSchema::Enumerant> *)local_3c8);
      break;
    case STRUCT:
      DynamicValue::Reader::as<capnp::DynamicStruct>
                ((ReaderFor<capnp::DynamicStruct> *)&nonUnionFields.size_,input);
      hasField_size = (size_t)DynamicStruct::Reader::getSchema((Reader *)&nonUnionFields.size_);
      StructSchema::getNonUnionFields((FieldSubset *)local_4d8,(StructSchema *)&hasField_size);
      uVar6 = StructSchema::FieldSubset::size((FieldSubset *)local_4d8);
      size = (ulong)uVar6;
      if (size < 0x21) {
        kj::Array<bool>::Array((Array<bool> *)&hasField.size_,(void *)0x0);
        AVar17 = kj::arrayPtr<bool>((bool *)&hasField_heap.disposer,size);
      }
      else {
        kj::heapArray<bool>((Array<bool> *)&hasField.size_,size);
        AVar17 = kj::Array::operator_cast_to_ArrayPtr((Array *)&hasField.size_);
      }
      hasField.ptr = (bool *)AVar17.size_;
      _auStack_540 = AVar17.ptr;
      __range3_2._4_4_ = 0;
      RVar18 = kj::indices<capnp::StructSchema::FieldSubset&>((FieldSubset *)local_4d8);
      __begin3_2.value = RVar18.begin_;
      __end3_2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3_2);
      i_2 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3_2);
      while (bVar3 = kj::Range<unsigned_long>::Iterator::operator==(&__end3_2,(Iterator *)&i_2),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        puVar12 = kj::Range<unsigned_long>::Iterator::operator*(&__end3_2);
        sVar9 = *puVar12;
        local_578 = (uint)sVar9;
        StructSchema::FieldSubset::operator[]
                  ((Field *)&which.ptr.field_1.value.proto._reader.nestingLimit,
                   (FieldSubset *)local_4d8,local_578);
        pIVar8 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
        field_00._8_8_ = uStack_5b0;
        field_00.parent.super_Schema.raw = (Schema)(Schema)which.ptr.field_1._56_8_;
        field_00.proto._reader.segment._0_4_ = (int)local_5a8;
        field_00.proto._reader.segment._4_4_ = (int)((ulong)local_5a8 >> 0x20);
        field_00.proto._reader.capTable._0_4_ = (int)uStack_5a0;
        field_00.proto._reader.capTable._4_4_ = (int)((ulong)uStack_5a0 >> 0x20);
        field_00.proto._reader.data = (void *)local_598;
        field_00.proto._reader.pointers = (WirePointer *)uStack_590;
        field_00.proto._reader._32_8_ = local_588;
        field_00.proto._reader._40_8_ = uStack_580;
        bVar3 = DynamicStruct::Reader::has((Reader *)&nonUnionFields.size_,field_00,pIVar8->hasMode)
        ;
        pbVar13 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)auStack_540,sVar9);
        *pbVar13 = bVar3;
        __range3_2._4_4_ = bVar3 + __range3_2._4_4_;
        kj::Range<unsigned_long>::Iterator::operator++(&__end3_2);
      }
      DynamicStruct::Reader::which
                ((Maybe<capnp::StructSchema::Field> *)local_600,(Reader *)&nonUnionFields.size_);
      _field317._7_1_ = 0;
      field = kj::_::readMaybe<capnp::StructSchema::Field>
                        ((Maybe<capnp::StructSchema::Field> *)local_600);
      if (field != (Field *)0x0) {
        local_658 = (field->parent).super_Schema.raw;
        uStack_650 = *(undefined8 *)&field->index;
        local_648 = (field->proto)._reader.segment;
        pCStack_640 = (field->proto)._reader.capTable;
        local_638 = (field->proto)._reader.data;
        pWStack_630 = (field->proto)._reader.pointers;
        local_628._0_4_ = (field->proto)._reader.dataSize;
        local_628._4_2_ = (field->proto)._reader.pointerCount;
        local_628._6_2_ = *(undefined2 *)&(field->proto)._reader.field_0x26;
        uStack_620 = *(undefined8 *)&(field->proto)._reader.nestingLimit;
        local_618 = field;
        pIVar8 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
        field_01._8_8_ = uStack_650;
        field_01.parent.super_Schema.raw = (Schema)(Schema)local_658;
        field_01.proto._reader.segment._0_4_ = (int)local_648;
        field_01.proto._reader.segment._4_4_ = (int)((ulong)local_648 >> 0x20);
        field_01.proto._reader.capTable._0_4_ = (int)pCStack_640;
        field_01.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_640 >> 0x20);
        field_01.proto._reader.data = local_638;
        field_01.proto._reader.pointers = pWStack_630;
        field_01.proto._reader.dataSize = (undefined4)local_628;
        field_01.proto._reader.pointerCount = local_628._4_2_;
        field_01.proto._reader._38_2_ = local_628._6_2_;
        field_01.proto._reader._40_8_ = uStack_620;
        bVar3 = DynamicStruct::Reader::has((Reader *)&nonUnionFields.size_,field_01,pIVar8->hasMode)
        ;
        _field317._7_1_ = ~bVar3 & 1;
        StructSchema::Field::getProto(&local_688,local_618);
        uVar5 = capnp::schema::Field::Reader::getDiscriminantValue(&local_688);
        local_d6d = 1;
        if (uVar5 == 0) {
          local_d6d = _field317._7_1_ ^ 0xff;
        }
        if ((local_d6d & 1) == 0) {
          kj::Maybe<capnp::StructSchema::Field>::operator=
                    ((Maybe<capnp::StructSchema::Field> *)local_600);
        }
        else {
          __range3_2._4_4_ = __range3_2._4_4_ + 1;
        }
      }
      json::Value::Builder::initObject((Builder *)&pos,&output,__range3_2._4_4_);
      __range3_3 = (Range<unsigned_long> *)0x0;
      RVar18 = kj::indices<capnp::StructSchema::FieldSubset&>((FieldSubset *)local_4d8);
      __begin3_3.value = RVar18.begin_;
      __end3_3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3_3);
      i_3 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3_3);
      while( true ) {
        bVar3 = kj::Range<unsigned_long>::Iterator::operator==(&__end3_3,(Iterator *)&i_3);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        puVar12 = kj::Range<unsigned_long>::Iterator::operator*(&__end3_3);
        field_1.proto._reader._40_8_ = *puVar12;
        StructSchema::FieldSubset::operator[]
                  ((Field *)&_unionField333,(FieldSubset *)local_4d8,
                   field_1.proto._reader.nestingLimit);
        this_00 = kj::_::readMaybe<capnp::StructSchema::Field>
                            ((Maybe<capnp::StructSchema::Field> *)local_600);
        if (this_00 != (Field *)0x0) {
          outField._builder._32_8_ = this_00;
          uVar6 = StructSchema::Field::getIndex(this_00);
          uVar7 = StructSchema::Field::getIndex((Field *)&_unionField333);
          if (uVar6 < uVar7) {
            uVar6 = (uint)__range3_3;
            __range3_3 = (Range<unsigned_long> *)((long)&__range3_3->begin_ + 1);
            List<capnp::json::Value::Field,_(capnp::Kind)3>::Builder::operator[]
                      ((Builder *)local_768,(Builder *)&pos,uVar6);
            StructSchema::Field::getProto(&local_7a8,(Field *)outField._builder._32_8_);
            AVar19 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_7a8);
            local_778 = AVar19;
            json::Value::Field::Builder::setName((Builder *)local_768,(Reader)AVar19);
            if ((_field317._7_1_ & 1) == 0) {
              local_818 = *(undefined8 *)outField._builder._32_8_;
              uStack_810 = *(undefined8 *)(outField._builder._32_8_ + 8);
              local_808 = *(undefined8 *)(outField._builder._32_8_ + 0x10);
              uStack_800 = *(undefined8 *)(outField._builder._32_8_ + 0x18);
              local_7f8 = *(undefined8 *)(outField._builder._32_8_ + 0x20);
              uStack_7f0 = *(undefined8 *)(outField._builder._32_8_ + 0x28);
              local_7e8 = *(undefined8 *)(outField._builder._32_8_ + 0x30);
              uStack_7e0 = *(undefined8 *)(outField._builder._32_8_ + 0x38);
              local_8a8 = *(undefined8 *)outField._builder._32_8_;
              uStack_8a0 = *(undefined8 *)(outField._builder._32_8_ + 8);
              local_898 = *(undefined8 *)(outField._builder._32_8_ + 0x10);
              uStack_890 = *(undefined8 *)(outField._builder._32_8_ + 0x18);
              local_888 = *(undefined8 *)(outField._builder._32_8_ + 0x20);
              uStack_880 = *(undefined8 *)(outField._builder._32_8_ + 0x28);
              local_878 = *(undefined8 *)(outField._builder._32_8_ + 0x30);
              uStack_870 = *(undefined8 *)(outField._builder._32_8_ + 0x38);
              field_02.proto._reader.segment._4_4_ = (int)((ulong)local_898 >> 0x20);
              field_02._0_20_ = *(undefined1 (*) [20])outField._builder._32_8_;
              field_02.proto._reader.capTable._0_4_ = (int)uStack_890;
              field_02.proto._reader.capTable._4_4_ = (int)((ulong)uStack_890 >> 0x20);
              field_02.proto._reader.data = (void *)local_888;
              field_02.proto._reader.pointers = (WirePointer *)uStack_880;
              field_02.proto._reader.dataSize = (int)local_878;
              field_02.proto._reader.pointerCount = (short)((ulong)local_878 >> 0x20);
              field_02.proto._reader._38_2_ = (short)((ulong)local_878 >> 0x30);
              field_02.proto._reader._40_8_ = uStack_870;
              DynamicStruct::Reader::get(&local_860,(Reader *)&nonUnionFields.size_,field_02);
              json::Value::Field::Builder::initValue(&local_8d0,(Builder *)local_768);
              field_03._8_8_ = uStack_810;
              field_03.parent.super_Schema.raw = (Schema)(Schema)local_818;
              field_03.proto._reader.segment._0_4_ = (int)local_808;
              field_03.proto._reader.segment._4_4_ = (int)((ulong)local_808 >> 0x20);
              field_03.proto._reader.capTable._0_4_ = (int)uStack_800;
              field_03.proto._reader.capTable._4_4_ = (int)((ulong)uStack_800 >> 0x20);
              field_03.proto._reader.data = (void *)local_7f8;
              field_03.proto._reader.pointers = (WirePointer *)uStack_7f0;
              field_03.proto._reader.dataSize = (undefined4)local_7e8;
              field_03.proto._reader.pointerCount = local_7e8._4_2_;
              field_03.proto._reader._38_2_ = local_7e8._6_2_;
              field_03.proto._reader._40_8_ = uStack_7e0;
              output_01._builder.capTable = local_8d0._builder.capTable;
              output_01._builder.segment = local_8d0._builder.segment;
              output_01._builder.data = local_8d0._builder.data;
              output_01._builder.pointers = local_8d0._builder.pointers;
              output_01._builder.dataSize = local_8d0._builder.dataSize;
              output_01._builder.pointerCount = local_8d0._builder.pointerCount;
              output_01._builder._38_2_ = local_8d0._builder._38_2_;
              encodeField(this,field_03,&local_860,output_01);
              DynamicValue::Reader::~Reader(&local_860);
            }
            else {
              json::Value::Field::Builder::initValue(&local_7d0,(Builder *)local_768);
              json::Value::Builder::setNull(&local_7d0);
            }
            kj::Maybe<capnp::StructSchema::Field>::operator=
                      ((Maybe<capnp::StructSchema::Field> *)local_600);
          }
        }
        pbVar13 = kj::ArrayPtr<bool>::operator[]
                            ((ArrayPtr<bool> *)auStack_540,field_1.proto._reader._40_8_);
        if ((*pbVar13 & 1U) != 0) {
          uVar6 = (uint)__range3_3;
          __range3_3 = (Range<unsigned_long> *)((long)&__range3_3->begin_ + 1);
          List<capnp::json::Value::Field,_(capnp::Kind)3>::Builder::operator[]
                    ((Builder *)local_900,(Builder *)&pos,uVar6);
          StructSchema::Field::getProto(&local_940,(Field *)&_unionField333);
          AVar19 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_940);
          local_910 = AVar19;
          json::Value::Field::Builder::setName((Builder *)local_900,(Reader)AVar19);
          local_958 = field_1.proto._reader.pointers;
          SStack_950 = field_1.proto._reader.dataSize;
          SStack_94c = field_1.proto._reader.pointerCount;
          uStack_94a = field_1.proto._reader._38_2_;
          local_968 = field_1.proto._reader.capTable;
          pvStack_960 = field_1.proto._reader.data;
          local_978 = field_1.index;
          uStack_974 = field_1._12_4_;
          pSStack_970 = field_1.proto._reader.segment;
          local_988 = _unionField333;
          SStack_980 = field_1.parent.super_Schema.raw;
          local_9e8 = field_1.proto._reader.pointers;
          SStack_9e0 = field_1.proto._reader.dataSize;
          SStack_9dc = field_1.proto._reader.pointerCount;
          uStack_9da = field_1.proto._reader._38_2_;
          local_9f8 = field_1.proto._reader.capTable;
          pvStack_9f0 = field_1.proto._reader.data;
          local_a08 = field_1.index;
          uStack_a04 = field_1._12_4_;
          pSStack_a00 = field_1.proto._reader.segment;
          local_a18 = _unionField333;
          SStack_a10 = field_1.parent.super_Schema.raw;
          field_04._8_8_ = field_1.parent.super_Schema.raw;
          field_04.parent.super_Schema.raw = (Schema)(Schema)_unionField333;
          field_04.proto._reader.segment._0_4_ = field_1.index;
          field_04.proto._reader.segment._4_4_ = field_1._12_4_;
          field_04.proto._reader.capTable._0_4_ = (int)field_1.proto._reader.segment;
          field_04.proto._reader.capTable._4_4_ =
               (int)((ulong)field_1.proto._reader.segment >> 0x20);
          field_04.proto._reader.data = field_1.proto._reader.capTable;
          field_04.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
          field_04.proto._reader._32_8_ = field_1.proto._reader.pointers;
          field_04.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
          field_04.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
          field_04.proto._reader._46_2_ = field_1.proto._reader._38_2_;
          DynamicStruct::Reader::get(&local_9d0,(Reader *)&nonUnionFields.size_,field_04);
          json::Value::Field::Builder::initValue(&local_a40,(Builder *)local_900);
          field_05._8_8_ = SStack_980.raw;
          field_05.parent.super_Schema.raw = (Schema)(Schema)local_988;
          field_05.proto._reader.segment._0_4_ = (uint)_local_978;
          field_05.proto._reader.segment._4_4_ = SUB84(_local_978,4);
          field_05.proto._reader.capTable._0_4_ = (int)pSStack_970;
          field_05.proto._reader.capTable._4_4_ = (int)((ulong)pSStack_970 >> 0x20);
          field_05.proto._reader.data = local_968;
          field_05.proto._reader.pointers = (WirePointer *)pvStack_960;
          field_05.proto._reader._32_8_ = local_958;
          field_05.proto._reader.nestingLimit = SStack_950;
          field_05.proto._reader._44_2_ = SStack_94c;
          field_05.proto._reader._46_2_ = uStack_94a;
          output_02._builder.capTable = local_a40._builder.capTable;
          output_02._builder.segment = local_a40._builder.segment;
          output_02._builder.data = local_a40._builder.data;
          output_02._builder.pointers = local_a40._builder.pointers;
          output_02._builder.dataSize = local_a40._builder.dataSize;
          output_02._builder.pointerCount = local_a40._builder.pointerCount;
          output_02._builder._38_2_ = local_a40._builder._38_2_;
          encodeField(this,field_05,&local_9d0,output_02);
          DynamicValue::Reader::~Reader(&local_9d0);
        }
        kj::Range<unsigned_long>::Iterator::operator++(&__end3_3);
      }
      bVar3 = kj::Maybe<capnp::StructSchema::Field>::operator==
                        ((Maybe<capnp::StructSchema::Field> *)local_600);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        local_a90 = kj::_::readMaybe<capnp::StructSchema::Field>
                              ((Maybe<capnp::StructSchema::Field> *)local_600);
        if (local_a90 == (Field *)0x0) {
          kj::_::Debug::Fault::Fault
                    (&local_a98,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x161,FAILED,"which != nullptr","");
          kj::_::Debug::Fault::fatal(&local_a98);
        }
        ppFVar14 = kj::mv<capnp::StructSchema::Field*>(&local_a90);
        outField_2._builder._32_8_ = *ppFVar14;
        _kj_result = (Field *)(((Field *)outField_2._builder._32_8_)->parent).super_Schema.raw;
        unionField_1.parent.super_Schema.raw =
             *(Schema *)&((Field *)outField_2._builder._32_8_)->index;
        unionField_1._8_8_ = (((Field *)outField_2._builder._32_8_)->proto)._reader.segment;
        unionField_1.proto._reader.segment =
             (SegmentReader *)(((Field *)outField_2._builder._32_8_)->proto)._reader.capTable;
        unionField_1.proto._reader.capTable =
             (CapTableReader *)(((Field *)outField_2._builder._32_8_)->proto)._reader.data;
        unionField_1.proto._reader.data =
             (((Field *)outField_2._builder._32_8_)->proto)._reader.pointers;
        unionField_1.proto._reader.pointers =
             *(WirePointer **)&(((Field *)outField_2._builder._32_8_)->proto)._reader.dataSize;
        unionField_1.proto._reader.dataSize =
             (((Field *)outField_2._builder._32_8_)->proto)._reader.nestingLimit;
        unionField_1.proto._reader.pointerCount =
             *(StructPointerCount *)
              &(((Field *)outField_2._builder._32_8_)->proto)._reader.field_0x2c;
        unionField_1.proto._reader._38_2_ =
             *(undefined2 *)&(((Field *)outField_2._builder._32_8_)->proto)._reader.field_0x2e;
        uVar6 = (uint)__range3_3;
        __range3_3 = (Range<unsigned_long> *)((long)&__range3_3->begin_ + 1);
        List<capnp::json::Value::Field,_(capnp::Kind)3>::Builder::operator[]
                  ((Builder *)local_ac8,(Builder *)&pos,uVar6);
        StructSchema::Field::getProto(&local_b08,(Field *)&_kj_result);
        local_ad8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_b08);
        json::Value::Field::Builder::setName((Builder *)local_ac8,(Reader)local_ad8);
        if ((_field317._7_1_ & 1) == 0) {
          local_b48 = unionField_1.proto._reader.pointers;
          SStack_b40 = unionField_1.proto._reader.dataSize;
          SStack_b3c = unionField_1.proto._reader.pointerCount;
          uStack_b3a = unionField_1.proto._reader._38_2_;
          local_b58 = unionField_1.proto._reader.capTable;
          pvStack_b50 = unionField_1.proto._reader.data;
          local_b68 = unionField_1.index;
          uStack_b64 = unionField_1._12_4_;
          pSStack_b60 = unionField_1.proto._reader.segment;
          local_b78 = _kj_result;
          SStack_b70 = unionField_1.parent.super_Schema.raw;
          field_06._8_8_ = unionField_1.parent.super_Schema.raw;
          field_06.parent.super_Schema.raw = (Schema)(Schema)_kj_result;
          field_06.proto._reader.segment._0_4_ = unionField_1.index;
          field_06.proto._reader.segment._4_4_ = unionField_1._12_4_;
          field_06.proto._reader.capTable._0_4_ = (int)unionField_1.proto._reader.segment;
          field_06.proto._reader.capTable._4_4_ =
               (int)((ulong)unionField_1.proto._reader.segment >> 0x20);
          field_06.proto._reader.data = unionField_1.proto._reader.capTable;
          field_06.proto._reader.pointers = (WirePointer *)unionField_1.proto._reader.data;
          field_06.proto._reader._32_8_ = unionField_1.proto._reader.pointers;
          field_06.proto._reader.nestingLimit = unionField_1.proto._reader.dataSize;
          field_06.proto._reader._44_2_ = unionField_1.proto._reader.pointerCount;
          field_06.proto._reader._46_2_ = unionField_1.proto._reader._38_2_;
          DynamicStruct::Reader::get(&local_bc0,(Reader *)&nonUnionFields.size_,field_06);
          json::Value::Field::Builder::initValue
                    ((Builder *)&_kjCondition.result,(Builder *)local_ac8);
          field_07._8_8_ = SStack_b70.raw;
          field_07.parent.super_Schema.raw = (Schema)(Schema)local_b78;
          field_07.proto._reader.segment._0_4_ = (uint)_local_b68;
          field_07.proto._reader.segment._4_4_ = SUB84(_local_b68,4);
          field_07.proto._reader.capTable._0_4_ = (int)pSStack_b60;
          field_07.proto._reader.capTable._4_4_ = (int)((ulong)pSStack_b60 >> 0x20);
          field_07.proto._reader.data = local_b58;
          field_07.proto._reader.pointers = (WirePointer *)pvStack_b50;
          field_07.proto._reader._32_8_ = local_b48;
          field_07.proto._reader.nestingLimit = SStack_b40;
          field_07.proto._reader._44_2_ = SStack_b3c;
          field_07.proto._reader._46_2_ = uStack_b3a;
          BVar2._builder.capTable = (CapTableBuilder *)uStack_c28;
          BVar2._builder.segment = (SegmentBuilder *)_kjCondition._32_8_;
          BVar2._builder.data = (void *)local_c20;
          BVar2._builder.pointers = (WirePointer *)uStack_c18;
          BVar2._builder._32_8_ = local_c10;
          encodeField(this,field_07,&local_bc0,BVar2);
          DynamicValue::Reader::~Reader(&local_bc0);
        }
        else {
          json::Value::Field::Builder::initValue(&local_b30,(Builder *)local_ac8);
          json::Value::Builder::setNull(&local_b30);
        }
      }
      f.exception = (Exception *)
                    kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                               (unsigned_long *)&__range3_3);
      kj::_::DebugExpression<unsigned_long&>::operator==
                ((DebugComparison<unsigned_long_&,_unsigned_int_&> *)local_c58,
                 (DebugExpression<unsigned_long&> *)&f,(uint *)((long)&__range3_2 + 4));
      bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c58);
      if (!bVar3) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x16a,FAILED,"pos == fieldCount","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_int_&> *)local_c58);
        kj::_::Debug::Fault::fatal(&f_1);
      }
      kj::Maybe<capnp::StructSchema::Field>::~Maybe((Maybe<capnp::StructSchema::Field> *)local_600);
      kj::Array<bool>::~Array((Array<bool> *)&hasField.size_);
      break;
    case INTERFACE:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[90]>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x16f,FAILED,(char *)0x0,
                 "\"don\'t know how to JSON-encode capabilities; \" \"please register a JsonCodec::Handler for this\""
                 ,(char (*) [90])
                  "don\'t know how to JSON-encode capabilities; please register a JsonCodec::Handler for this"
                );
      kj::_::Debug::Fault::fatal(&f_2);
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[88]>
                (&local_c78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x172,FAILED,(char *)0x0,
                 "\"don\'t know how to JSON-encode AnyPointer; \" \"please register a JsonCodec::Handler for this\""
                 ,(char (*) [88])
                  "don\'t know how to JSON-encode AnyPointer; please register a JsonCodec::Handler for this"
                );
      kj::_::Debug::Fault::fatal(&local_c78);
    }
  }
  else {
    pHVar1 = *local_40;
    DynamicValue::Reader::Reader(&local_88,input);
    BVar2 = output;
    local_98._0_4_ = output._builder.dataSize;
    local_98._4_2_ = output._builder.pointerCount;
    local_98._6_2_ = output._builder._38_2_;
    output._builder.segment = BVar2._builder.segment;
    local_b8 = output._builder.segment;
    output._builder.capTable = BVar2._builder.capTable;
    pCStack_b0 = output._builder.capTable;
    output._builder.data = BVar2._builder.data;
    local_a8 = output._builder.data;
    output._builder.pointers = BVar2._builder.pointers;
    pWStack_a0 = output._builder.pointers;
    output = BVar2;
    (**pHVar1->_vptr_HandlerBase)(pHVar1,this,&local_88);
    DynamicValue::Reader::~Reader(&local_88);
  }
  return;
}

Assistant:

void JsonCodec::encode(DynamicValue::Reader input, Type type, JsonValue::Builder output) const {
  // TODO(someday): For interfaces, check for handlers on superclasses, per documentation...
  // TODO(someday): For branded types, should we check for handlers on the generic?
  // TODO(someday): Allow registering handlers for "all structs", "all lists", etc?
  KJ_IF_SOME(handler, impl->typeHandlers.find(type)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  switch (type.which()) {
    case schema::Type::VOID:
      output.setNull();
      break;
    case schema::Type::BOOL:
      output.setBoolean(input.as<bool>());
      break;
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
      output.setNumber(input.as<double>());
      break;
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
      {
        double value = input.as<double>();
        // Inf, -inf and NaN are not allowed in the JSON spec. Storing into string.
        if (kj::inf() == value) {
          output.setString("Infinity");
        } else if (-kj::inf() == value) {
          output.setString("-Infinity");
        } else if (kj::isNaN(value)) {
          output.setString("NaN");
        } else {
          output.setNumber(value);
        }
      }
      break;
    case schema::Type::INT64:
      output.setString(kj::str(input.as<int64_t>()));
      break;
    case schema::Type::UINT64:
      output.setString(kj::str(input.as<uint64_t>()));
      break;
    case schema::Type::TEXT:
      output.setString(kj::str(input.as<Text>()));
      break;
    case schema::Type::DATA: {
      // Turn into array of byte values. Yep, this is pretty ugly. People really need to override
      // this with a handler.
      auto bytes = input.as<Data>();
      auto array = output.initArray(bytes.size());
      for (auto i: kj::indices(bytes)) {
        array[i].setNumber(bytes[i]);
      }
      break;
    }
    case schema::Type::LIST: {
      auto list = input.as<DynamicList>();
      auto elementType = type.asList().getElementType();
      auto array = output.initArray(list.size());
      for (auto i: kj::indices(list)) {
        encode(list[i], elementType, array[i]);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto e = input.as<DynamicEnum>();
      KJ_IF_SOME(symbol, e.getEnumerant()) {
        output.setString(symbol.getProto().getName());
      } else {
        output.setNumber(e.getRaw());
      }
      break;
    }
    case schema::Type::STRUCT: {
      auto structValue = input.as<capnp::DynamicStruct>();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      KJ_STACK_ARRAY(bool, hasField, nonUnionFields.size(), 32, 128);

      uint fieldCount = 0;
      for (auto i: kj::indices(nonUnionFields)) {
        fieldCount += (hasField[i] = structValue.has(nonUnionFields[i], impl->hasMode));
      }

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();
      bool unionFieldIsNull = false;

      KJ_IF_SOME(field, which) {
        // Even if the union field is null, if it is not the default field of the union then we
        // have to print it anyway.
        unionFieldIsNull = !structValue.has(field, impl->hasMode);
        if (field.getProto().getDiscriminantValue() != 0 || !unionFieldIsNull) {
          ++fieldCount;
        } else {
          which = kj::none;
        }
      }

      auto object = output.initObject(fieldCount);

      size_t pos = 0;
      for (auto i: kj::indices(nonUnionFields)) {
        auto field = nonUnionFields[i];
        KJ_IF_SOME(unionField, which) {
          if (unionField.getIndex() < field.getIndex()) {
            auto outField = object[pos++];
            outField.setName(unionField.getProto().getName());
            if (unionFieldIsNull) {
              outField.initValue().setNull();
            } else {
              encodeField(unionField, structValue.get(unionField), outField.initValue());
            }
            which = kj::none;
          }
        }
        if (hasField[i]) {
          auto outField = object[pos++];
          outField.setName(field.getProto().getName());
          encodeField(field, structValue.get(field), outField.initValue());
        }
      }
      if (which != kj::none) {
        // Union field not printed yet; must be last.
        auto unionField = KJ_ASSERT_NONNULL(which);
        auto outField = object[pos++];
        outField.setName(unionField.getProto().getName());
        if (unionFieldIsNull) {
          outField.initValue().setNull();
        } else {
          encodeField(unionField, structValue.get(unionField), outField.initValue());
        }
      }
      KJ_ASSERT(pos == fieldCount);
      break;
    }
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("don't know how to JSON-encode capabilities; "
                      "please register a JsonCodec::Handler for this");
    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("don't know how to JSON-encode AnyPointer; "
                      "please register a JsonCodec::Handler for this");
  }